

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O3

jas_cmprof_t * jas_cmprof_createfromclrspc(int clrspc)

{
  int iVar1;
  jas_cmprof_t *pjVar2;
  jas_cmpxform_t *pxform;
  jas_cmpxform_t *pxform_00;
  jas_iccprof_t *iccprof;
  long lVar3;
  
  if (clrspc == 0x501) {
    pjVar2 = jas_cmprof_createfromclrspc(0x401);
    if (pjVar2 != (jas_cmprof_t *)0x0) {
      pjVar2->clrspc = 0x501;
      if ((pjVar2->numchans != 3) || (pjVar2->numrefchans != 3)) {
        __assert_fail("prof->numchans == 3 && prof->numrefchans == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                      ,0xba,"jas_cmprof_t *jas_cmprof_createsycc()");
      }
      if (pjVar2->refclrspc != 0x101) {
        __assert_fail("prof->refclrspc == JAS_CLRSPC_CIEXYZ",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_cm.c"
                      ,0xbb,"jas_cmprof_t *jas_cmprof_createsycc()");
      }
      pxform = jas_cmpxform_createshapmat();
      if (pxform != (jas_cmpxform_t *)0x0) {
        pxform->numinchans = 3;
        pxform->numoutchans = 3;
        (pxform->data).dummy = 0.0;
        *(undefined8 *)((long)&pxform->data + 8) = 0x100000000;
        (pxform->data).shapmat.mat[0][0] = 1.0;
        (pxform->data).shapmat.mat[0][1] = 0.0;
        (pxform->data).shapmat.mat[1][0] = 1.0;
        (pxform->data).shapmat.mat[1][1] = -0.34413;
        (pxform->data).shapmat.mat[2][0] = 1.0;
        (pxform->data).shapmat.mat[2][1] = 1.772;
        (pxform->data).shapmat.mat[0][2] = 1.402;
        (pxform->data).shapmat.mat[0][3] = -0.701;
        (pxform->data).shapmat.mat[1][2] = -0.71414;
        (pxform->data).shapmat.mat[1][3] = 0.529135;
        *(undefined4 *)((long)&pxform->data + 0x90) = 0;
        *(undefined4 *)((long)&pxform->data + 0x94) = 0;
        *(undefined4 *)((long)&pxform->data + 0x98) = 0xac083127;
        *(undefined4 *)((long)&pxform->data + 0x9c) = 0xbfec5a1c;
        pxform_00 = jas_cmpxform_createshapmat();
        if (pxform_00 != (jas_cmpxform_t *)0x0) {
          pxform_00->numinchans = 3;
          pxform_00->numoutchans = 3;
          (pxform_00->data).dummy = 2.12199579096527e-314;
          *(undefined8 *)((long)&pxform_00->data + 8) = 0x100000000;
          jas_cmshapmat_invmat((pxform_00->data).shapmat.mat,(pxform->data).shapmat.mat);
          lVar3 = 3;
          while (((pjVar2->pxformseqs[lVar3 + -3] == (jas_cmpxformseq_t *)0x0 ||
                  (iVar1 = jas_cmpxformseq_insertpxform(pjVar2->pxformseqs[lVar3 + -3],0,pxform),
                  iVar1 == 0)) &&
                 ((pjVar2->pxformseqs[lVar3 + 1] == (jas_cmpxformseq_t *)0x0 ||
                  (iVar1 = jas_cmpxformseq_insertpxform(pjVar2->pxformseqs[lVar3 + 1],-1,pxform_00),
                  iVar1 == 0))))) {
            lVar3 = lVar3 + 1;
            if (lVar3 == 7) {
              iVar1 = pxform->refcnt;
              pxform->refcnt = iVar1 + -1;
              if (iVar1 < 2) {
                (*pxform->ops->destroy)(pxform);
                jas_free(pxform);
              }
              iVar1 = pxform_00->refcnt;
              pxform_00->refcnt = iVar1 + -1;
              if (1 < iVar1) {
                return pjVar2;
              }
              (*pxform_00->ops->destroy)(pxform_00);
              jas_free(pxform_00);
              return pjVar2;
            }
          }
        }
        iVar1 = pxform->refcnt;
        pxform->refcnt = iVar1 + -1;
        if (iVar1 < 2) {
          (*pxform->ops->destroy)(pxform);
          jas_free(pxform);
        }
        if ((pxform_00 != (jas_cmpxform_t *)0x0) &&
           (iVar1 = pxform_00->refcnt, pxform_00->refcnt = iVar1 + -1, iVar1 < 2)) {
          (*pxform_00->ops->destroy)(pxform_00);
          jas_free(pxform_00);
        }
      }
    }
  }
  else {
    iccprof = jas_iccprof_createfromclrspc(clrspc);
    if (iccprof != (jas_iccprof_t *)0x0) {
      pjVar2 = jas_cmprof_createfromiccprof(iccprof);
      jas_iccprof_destroy(iccprof);
      if (pjVar2 != (jas_cmprof_t *)0x0) {
        if ((char)clrspc == '\0') {
          return pjVar2;
        }
        pjVar2->clrspc = clrspc;
        return pjVar2;
      }
    }
  }
  return (jas_cmprof_t *)0x0;
}

Assistant:

jas_cmprof_t *jas_cmprof_createfromclrspc(int clrspc)
{
	jas_iccprof_t *iccprof;
	jas_cmprof_t *prof;

	iccprof = 0;
	prof = 0;
	switch (clrspc) {
	case JAS_CLRSPC_SYCBCR:
		if (!(prof = jas_cmprof_createsycc()))
			goto error;
		break;
	default:
		if (!(iccprof = jas_iccprof_createfromclrspc(clrspc)))
			goto error;
		if (!(prof = jas_cmprof_createfromiccprof(iccprof)))
			goto error;
		jas_iccprof_destroy(iccprof);
		iccprof = 0;
		if (!jas_clrspc_isgeneric(clrspc))
			prof->clrspc = clrspc;
		break;
	}
	return prof;
error:
	if (iccprof)
		jas_iccprof_destroy(iccprof);
	return 0;
}